

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-default-loop-close.c
# Opt level: O1

int run_test_default_loop_close(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  uv_loop_t *in_RDI;
  uv_timer_t timer_handle;
  
  puVar2 = uv_default_loop();
  if (puVar2 == (uv_loop_t *)0x0) {
    run_test_default_loop_close_cold_13();
LAB_0014b446:
    run_test_default_loop_close_cold_1();
LAB_0014b44b:
    run_test_default_loop_close_cold_2();
LAB_0014b450:
    run_test_default_loop_close_cold_3();
LAB_0014b455:
    puVar2 = in_RDI;
    run_test_default_loop_close_cold_4();
LAB_0014b45a:
    run_test_default_loop_close_cold_5();
LAB_0014b45f:
    run_test_default_loop_close_cold_12();
LAB_0014b464:
    run_test_default_loop_close_cold_6();
LAB_0014b469:
    run_test_default_loop_close_cold_7();
LAB_0014b46e:
    run_test_default_loop_close_cold_8();
LAB_0014b473:
    loop = puVar2;
    run_test_default_loop_close_cold_9();
  }
  else {
    in_RDI = puVar2;
    iVar1 = uv_timer_init(puVar2,(uv_timer_t *)&stack0xffffffffffffff60);
    if (iVar1 != 0) goto LAB_0014b446;
    in_RDI = (uv_loop_t *)&stack0xffffffffffffff60;
    iVar1 = uv_timer_start((uv_timer_t *)in_RDI,timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0014b44b;
    in_RDI = puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0014b450;
    if (timer_cb_called != 1) goto LAB_0014b455;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 != 0) goto LAB_0014b45a;
    loop = uv_default_loop();
    if (loop == (uv_loop_t *)0x0) goto LAB_0014b45f;
    puVar2 = loop;
    iVar1 = uv_timer_init(loop,(uv_timer_t *)&stack0xffffffffffffff60);
    if (iVar1 != 0) goto LAB_0014b464;
    puVar2 = (uv_loop_t *)&stack0xffffffffffffff60;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0014b469;
    puVar2 = loop;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0014b46e;
    if (timer_cb_called != 2) goto LAB_0014b473;
    iVar1 = uv_loop_close(loop);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014b47d;
    }
  }
  run_test_default_loop_close_cold_10();
LAB_0014b47d:
  run_test_default_loop_close_cold_11();
  timer_cb_called = timer_cb_called + 1;
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(default_loop_close) {
  uv_loop_t* loop;
  uv_timer_t timer_handle;

  loop = uv_default_loop();
  ASSERT(loop != NULL);

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);
  ASSERT(0 == uv_loop_close(loop));

  loop = uv_default_loop();
  ASSERT(loop != NULL);

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(2 == timer_cb_called);
  ASSERT(0 == uv_loop_close(loop));

  MAKE_VALGRIND_HAPPY();
  return 0;
}